

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::DeepTiledOutputFile::writeTiles
          (DeepTiledOutputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  value_type pTVar1;
  bool bVar2;
  size_type sVar3;
  ArgExc *pAVar4;
  ostream *poVar5;
  int *piVar6;
  Task *pTVar7;
  TileBuffer *this_00;
  TaskGroup *group;
  size_type sVar8;
  reference ppTVar9;
  IoExc *this_01;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  void *__stat_loc;
  DeepTiledOutputFile *in_RDI;
  int in_R8D;
  int in_R9D;
  char *unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  int in_stack_00000010;
  int in_stack_00000014;
  Data *in_stack_00000018;
  uint64_t in_stack_00000030;
  uint64_t in_stack_00000038;
  char *in_stack_00000040;
  uint64_t in_stack_00000048;
  stringstream _iex_replace_s;
  BaseExc *e;
  TileBuffer *tileBuffer;
  size_t i;
  string *exception;
  TileBuffer *writeBuffer;
  int dyWrite;
  int dxWrite;
  int nextWriteBuffer;
  int dyComp;
  int dxComp;
  int nextCompBuffer;
  TaskGroup taskGroup;
  int numTasks;
  int numTiles;
  int dY;
  int dyStart;
  stringstream _iex_throw_s;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_fffffffffffffb88;
  lock_guard<std::mutex> *in_stack_fffffffffffffb90;
  DeepTiledOutputFile *in_stack_fffffffffffffb98;
  Data *in_stack_fffffffffffffba0;
  int in_stack_fffffffffffffbc4;
  undefined8 in_stack_fffffffffffffbc8;
  Data *in_stack_fffffffffffffbd0;
  TaskGroup *in_stack_fffffffffffffbd8;
  TileBufferTask *in_stack_fffffffffffffbe0;
  TileBuffer *this_02;
  undefined8 in_stack_fffffffffffffbf8;
  size_type local_220;
  string *local_218;
  int local_204;
  uint local_200;
  int local_1f8;
  int local_1f4;
  TaskGroup local_1f0 [12];
  int local_1e4;
  int local_1e0;
  int local_1dc [3];
  stringstream local_1d0 [16];
  ostream local_1c0 [404];
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c [3];
  
  local_2c = in_R9D;
  local_28 = in_R8D;
  local_24 = in_ECX;
  local_20 = in_EDX;
  local_1c[0] = in_ESI;
  std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  sVar3 = std::
          vector<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TOutSliceInfo_*>_>
          ::size(&in_RDI->_data->slices);
  if (sVar3 == 0) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  bVar2 = isValidTile(in_RDI,local_1c[0],local_24,local_2c,in_stack_00000008);
  if ((!bVar2) || (bVar2 = isValidTile(in_RDI,local_20,local_28,local_2c,in_stack_00000008), !bVar2)
     ) {
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,"Tile coordinates are invalid.");
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  bVar2 = isValidLevel(in_stack_fffffffffffffb98,(int)((ulong)in_stack_fffffffffffffb90 >> 0x20),
                       (int)in_stack_fffffffffffffb90);
  if (!bVar2) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1d0);
    poVar5 = std::operator<<(local_1c0,"Level coordinate (");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_2c);
    poVar5 = std::operator<<(poVar5,", ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,in_stack_00000008);
    std::operator<<(poVar5,") is invalid.");
    pAVar4 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar4,local_1d0);
    __cxa_throw(pAVar4,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  if (local_20 < local_1c[0]) {
    std::swap<int>(local_1c,&local_20);
  }
  if (local_28 < local_24) {
    std::swap<int>(&local_24,&local_28);
  }
  local_1dc[2] = local_24;
  local_1dc[1] = 1;
  if (in_RDI->_data->lineOrder == DECREASING_Y) {
    local_1dc[2] = local_28;
    local_1dc[1] = 0xffffffff;
  }
  local_1dc[0] = ((local_20 - local_1c[0]) + 1) * ((local_28 - local_24) + 1);
  sVar3 = std::
          vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
          ::size(&in_RDI->_data->tileBuffers);
  local_1e4 = (int)sVar3;
  piVar6 = std::min<int>(&local_1e4,local_1dc);
  local_1e0 = *piVar6;
  IlmThread_3_4::TaskGroup::TaskGroup(local_1f0);
  local_1f4 = 0;
  local_1f8 = local_1c[0];
  while (local_1f4 < local_1e0) {
    pTVar7 = (Task *)operator_new(0x20);
    local_1f4 = local_1f4 + 1;
    anon_unknown_7::TileBufferTask::TileBufferTask
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
               (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(int)in_stack_fffffffffffffbc8,
               in_stack_fffffffffffffbc4,(int)piVar6,(int)in_stack_fffffffffffffbf8);
    IlmThread_3_4::ThreadPool::addGlobalTask(pTVar7);
    local_1f8 = local_1f8 + 1;
    if (local_20 < local_1f8) {
      local_1f8 = local_1c[0];
    }
  }
  local_200 = 0;
  local_204 = local_1c[0];
  while ((int)local_200 < local_1dc[0]) {
    __stat_loc = (void *)(ulong)local_200;
    this_00 = Data::getTileBuffer(in_stack_fffffffffffffba0,
                                  (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
    this_02 = this_00;
    anon_unknown_7::TileBuffer::wait(this_00,__stat_loc);
    in_stack_fffffffffffffb98 = (DeepTiledOutputFile *)this_00->sampleCountTablePtr;
    in_stack_fffffffffffffba0 = (Data *)this_00->sampleCountTableSize;
    anon_unknown_7::bufferedTileWrite
              (in_stack_00000018,in_stack_00000014,in_stack_00000010,in_stack_0000000c,
               in_stack_00000008,unaff_retaddr,in_stack_00000030,in_stack_00000038,in_stack_00000040
               ,in_stack_00000048);
    anon_unknown_7::TileBuffer::post((TileBuffer *)0x1c5216);
    if (local_1f4 < local_1dc[0]) {
      group = (TaskGroup *)operator_new(0x20);
      anon_unknown_7::TileBufferTask::TileBufferTask
                ((TileBufferTask *)this_02,group,in_stack_fffffffffffffbd0,
                 (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),(int)in_stack_fffffffffffffbc8,
                 in_stack_fffffffffffffbc4,(int)piVar6,(int)in_stack_fffffffffffffbf8);
      IlmThread_3_4::ThreadPool::addGlobalTask((Task *)group);
    }
    local_200 = local_200 + 1;
    local_204 = local_204 + 1;
    if (local_20 < local_204) {
      local_204 = local_1c[0];
    }
    local_1f4 = local_1f4 + 1;
    local_1f8 = local_1f8 + 1;
    if (local_20 < local_1f8) {
      local_1f8 = local_1c[0];
    }
  }
  IlmThread_3_4::TaskGroup::~TaskGroup(local_1f0);
  local_218 = (string *)0x0;
  local_220 = 0;
  while (sVar3 = local_220,
        sVar8 = std::
                vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
                ::size(&in_RDI->_data->tileBuffers), sVar3 < sVar8) {
    ppTVar9 = std::
              vector<Imf_3_4::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_3_4::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[](&in_RDI->_data->tileBuffers,local_220);
    pTVar1 = *ppTVar9;
    if (((pTVar1->hasException & 1U) != 0) && (local_218 == (string *)0x0)) {
      local_218 = (string *)&pTVar1->exception;
    }
    pTVar1->hasException = false;
    local_220 = local_220 + 1;
  }
  if (local_218 == (string *)0x0) {
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1c54d6);
    return;
  }
  this_01 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(this_01,local_218);
  __cxa_throw(this_01,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void
DeepTiledOutputFile::writeTiles (
    int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    try
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif

        if (_data->slices.size () == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                                         "as pixel data source.");

        if (!isValidTile (dx1, dy1, lx, ly) || !isValidTile (dx2, dy2, lx, ly))
            throw IEX_NAMESPACE::ArgExc ("Tile coordinates are invalid.");

        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");
        //
        // Determine the first and last tile coordinates in both dimensions
        // based on the file's lineOrder
        //

        if (dx1 > dx2) swap (dx1, dx2);

        if (dy1 > dy2) swap (dy1, dy2);

        int dyStart = dy1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dY      = -1;
        }

        int numTiles = (dx2 - dx1 + 1) * (dy2 - dy1 + 1);
        int numTasks = min ((int) _data->tileBuffers.size (), numTiles);

        //
        // Create a task group for all tile buffer tasks.  When the
        // task group goes out of scope, the destructor waits until
        // all tasks are complete.
        //

        {
            TaskGroup taskGroup;

            //
            // Add in the initial compression tasks to the thread pool
            //

            int nextCompBuffer = 0;
            int dxComp         = dx1;
            int dyComp         = dyStart;

            while (nextCompBuffer < numTasks)
            {
                ThreadPool::addGlobalTask (new TileBufferTask (
                    &taskGroup,
                    _data,
                    nextCompBuffer++,
                    dxComp,
                    dyComp,
                    lx,
                    ly));
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // Write the compressed buffers and add in more compression
            // tasks until done
            //

            int nextWriteBuffer = 0;
            int dxWrite         = dx1;
            int dyWrite         = dyStart;

            while (nextWriteBuffer < numTiles)
            {
                //
                // Wait until the nextWriteBuffer is ready to be written
                //

                TileBuffer* writeBuffer =
                    _data->getTileBuffer (nextWriteBuffer);

                writeBuffer->wait ();

                //
                // Write the tilebuffer
                //

                bufferedTileWrite (
                    _data,
                    dxWrite,
                    dyWrite,
                    lx,
                    ly,
                    writeBuffer->dataPtr,
                    writeBuffer->dataSize,
                    writeBuffer->uncompressedSize,
                    writeBuffer->sampleCountTablePtr,
                    writeBuffer->sampleCountTableSize);

                //
                // Release the lock on nextWriteBuffer
                //

                writeBuffer->post ();

                //
                // If there are no more tileBuffers to compress, then
                // only continue to write out remaining tileBuffers,
                // otherwise keep adding compression tasks.
                //

                if (nextCompBuffer < numTiles)
                {
                    //
                    // add nextCompBuffer as a compression Task
                    //

                    ThreadPool::addGlobalTask (new TileBufferTask (
                        &taskGroup,
                        _data,
                        nextCompBuffer,
                        dxComp,
                        dyComp,
                        lx,
                        ly));
                }

                nextWriteBuffer++;
                dxWrite++;

                if (dxWrite > dx2)
                {
                    dxWrite = dx1;
                    dyWrite += dY;
                }

                nextCompBuffer++;
                dxComp++;

                if (dxComp > dx2)
                {
                    dxComp = dx1;
                    dyComp += dY;
                }
            }

            //
            // finish all tasks
            //
        }

        //
        // Exception handling:
        //
        // TileBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to TiledOutputFile::writeTiles().
        // TileBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the tile buffers.
        // Now we check if any tile buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple tile buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string* exception = 0;

        for (size_t i = 0; i < _data->tileBuffers.size (); ++i)
        {
            TileBuffer* tileBuffer = _data->tileBuffers[i];

            if (tileBuffer->hasException && !exception)
                exception = &tileBuffer->exception;

            tileBuffer->hasException = false;
        }

        if (exception) throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Failed to write pixel data to image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}